

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void print_conditions(NODE *n)

{
  node *pnVar1;
  NODE *n_00;
  ulong uVar2;
  NODE *pNVar3;
  
  while (pNVar3 = n, pNVar3 != (NODE *)0x0) {
    pnVar1 = (pNVar3->u).QUERY.relattrlist;
    print_relattr((pnVar1->u).QUERY.relattrlist);
    uVar2 = (ulong)(pnVar1->u).CONDITION.op;
    if (uVar2 < 7) {
      printf(&DAT_0011976c + *(int *)(&DAT_0011976c + uVar2 * 4));
    }
    n_00 = (pnVar1->u).QUERY.conditionlist;
    if (n_00 == (NODE *)0x0) {
      print_value((pnVar1->u).UPDATE.conditionlist);
    }
    else {
      print_relattr(n_00);
    }
    n = (NODE *)0x0;
    if ((pNVar3->u).CREATETABLE.attrlist != (node *)0x0) {
      printf(" and");
      n = (pNVar3->u).CREATETABLE.attrlist;
    }
  }
  return;
}

Assistant:

static void print_conditions(NODE *n)
{
   for(; n != NULL; n = n -> u.LIST.next){
      print_condition(n->u.LIST.curr);
      if(n -> u.LIST.next != NULL)
         printf(" and");
   }
}